

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O3

void __thiscall t_st_generator::generate_recv_method(t_st_generator *this,t_function *function)

{
  ofstream_with_content_based_conditional_update *out;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  t_program *program;
  t_type *ptVar3;
  t_struct *ptVar4;
  int iVar5;
  t_field *this_00;
  long *plVar6;
  ostream *poVar7;
  size_type *psVar8;
  pointer pptVar9;
  string funname;
  string signature;
  t_field success;
  t_struct result;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c8;
  size_type local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  t_field local_1a8;
  t_struct local_f8;
  
  pcVar2 = (function->name_)._M_dataplus._M_p;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar2,pcVar2 + (function->name_)._M_string_length);
  t_generator::camelcase(&local_228,(t_generator *)this,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  function_signature_abi_cxx11_(&local_1c8,this,function);
  program = (this->super_t_oop_generator).super_t_generator.program_;
  psVar8 = &local_1a8.super_t_doc.doc_._M_string_length;
  local_1a8.super_t_doc._vptr_t_doc = (_func_int **)psVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"TResult","");
  t_struct::t_struct(&local_f8,program,(string *)&local_1a8);
  if (local_1a8.super_t_doc._vptr_t_doc != (_func_int **)psVar8) {
    operator_delete(local_1a8.super_t_doc._vptr_t_doc);
  }
  ptVar3 = function->returntype_;
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"success","");
  t_field::t_field(&local_1a8,ptVar3,&local_248,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  t_struct::append(&local_f8,&local_1a8);
  ptVar4 = function->xceptions_;
  pptVar9 = (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar9 !=
      (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      this_00 = (t_field *)operator_new(0xb0);
      ptVar3 = (*pptVar9)->type_;
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"exception","");
      t_field::t_field(this_00,ptVar3,&local_268,(*pptVar9)->key_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      t_struct::append(&local_f8,this_00);
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 !=
             (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  client_class_name_abi_cxx11_(&local_208,this);
  local_3c8 = &local_3b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c8,local_228._M_dataplus._M_p,
             local_228._M_dataplus._M_p + local_228._M_string_length);
  paVar1 = local_3c8;
  iVar5 = toupper((int)local_3c8->_M_local_buf[0]);
  paVar1->_M_local_buf[0] = (char)iVar5;
  paVar1 = &local_3a8.field_2;
  if (local_3c8 == &local_3b8) {
    local_3a8.field_2._8_8_ = local_3b8._8_8_;
    local_3a8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_3a8._M_dataplus._M_p = (pointer)local_3c8;
  }
  local_3a8._M_string_length = local_3c0;
  local_3c0 = 0;
  local_3b8._M_local_buf[0] = '\0';
  local_3c8 = &local_3b8;
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_3a8,0,(char *)0x0,0x3a8f94);
  out = &this->f_;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_388.field_2._M_allocated_capacity = *psVar8;
    local_388.field_2._8_8_ = plVar6[3];
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  }
  else {
    local_388.field_2._M_allocated_capacity = *psVar8;
    local_388._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_388._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  st_method(this,(ostream *)out,&local_208,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if (local_3c8 != &local_3b8) {
    operator_delete(local_3c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"| f msg res | ",0xe);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_3a8,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_3a8._M_dataplus._M_p,local_3a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"msg := oprot readMessageBegin.",0x1e);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_288,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"self validateRemoteMessage: msg.",0x20)
  ;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_2a8,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"res := ",7);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"");
  struct_reader(&local_2c8,this,&local_f8,&local_2e8);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_308,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_308._M_dataplus._M_p,local_308._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot readMessageEnd.",0x15);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_328,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_328._M_dataplus._M_p,local_328._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot transport flush.",0x16);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_348,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_348._M_dataplus._M_p,local_348._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"res exception ifNotNil: [res exception signal].",0x2f);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_368,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_368._M_dataplus._M_p,local_368._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"^ res",5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  st_close_method(this,(ostream *)out);
  t_field::~t_field(&local_1a8);
  local_f8.super_t_type.super_t_doc._vptr_t_doc = (_func_int **)&PTR__t_struct_0040eeb8;
  if (local_f8.members_in_id_order_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.members_in_id_order_.
                    super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f8.members_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.members_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  t_type::~t_type(&local_f8.super_t_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_st_generator::generate_recv_method(t_function* function) {
  string funname = camelcase(function->get_name());
  string signature = function_signature(function);

  t_struct result(program_, "TResult");
  t_field success(function->get_returntype(), "success", 0);
  result.append(&success);

  t_struct* xs = function->get_xceptions();
  const vector<t_field*>& fields = xs->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    // duplicate the field, but call it "exception"... we don't need a dynamic name
    t_field* exception = new t_field((*f_iter)->get_type(), "exception", (*f_iter)->get_key());
    result.append(exception);
  }

  st_method(f_, client_class_name(), "recv" + capitalize(funname));
  f_ << "| f msg res | " << endl << indent() << "msg := oprot readMessageBegin." << endl << indent()
     << "self validateRemoteMessage: msg." << endl << indent()
     << "res := " << struct_reader(&result) << "." << endl << indent() << "oprot readMessageEnd."
     << endl << indent() << "oprot transport flush." << endl << indent()
     << "res exception ifNotNil: [res exception signal]." << endl << indent() << "^ res";
  st_close_method(f_);
}